

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_stack.hpp
# Opt level: O3

void __thiscall asio::detail::scheduler::capture_current_exception(scheduler *this)

{
  long lVar1;
  exception_ptr eVar2;
  void *pvVar3;
  long *plVar4;
  long in_FS_OFFSET;
  void *pvStack_48;
  exception_ptr eStack_40;
  long lStack_38;
  undefined **ppuStack_30;
  void *pvStack_28;
  
  plVar4 = *(long **)(in_FS_OFFSET + -0x10);
  while( true ) {
    if (plVar4 == (long *)0x0) {
      return;
    }
    if ((scheduler *)*plVar4 == this) break;
    plVar4 = (long *)plVar4[2];
  }
  lVar1 = plVar4[1];
  if (lVar1 == 0) {
    return;
  }
  if (*(int *)(lVar1 + 0x50) == 1) {
    *(undefined4 *)(lVar1 + 0x50) = 2;
    eStack_40._M_exception_object = *(void **)(lVar1 + 0x58);
    if (eStack_40._M_exception_object == (void *)0x0) {
      pvStack_28 = (void *)0x0;
    }
    else {
      std::__exception_ptr::exception_ptr::_M_addref();
      pvStack_28 = eStack_40._M_exception_object;
    }
    ppuStack_30 = &PTR__multiple_exceptions_00154df8;
    eStack_40._M_exception_object = (void *)0x0;
    std::make_exception_ptr<asio::multiple_exceptions>((multiple_exceptions *)&pvStack_48);
    pvVar3 = pvStack_48;
    pvStack_48 = (void *)0x0;
    lStack_38 = *(long *)(lVar1 + 0x58);
    *(void **)(lVar1 + 0x58) = pvVar3;
    if ((lStack_38 != 0) &&
       (std::__exception_ptr::exception_ptr::_M_release(), pvStack_48 != (void *)0x0)) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    ppuStack_30 = &PTR__multiple_exceptions_00154df8;
    if (pvStack_28 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    std::exception::~exception((exception *)&ppuStack_30);
    eVar2._M_exception_object = eStack_40._M_exception_object;
  }
  else {
    if (*(int *)(lVar1 + 0x50) != 0) {
      return;
    }
    *(undefined4 *)(lVar1 + 0x50) = 1;
    std::current_exception();
    pvVar3 = pvStack_48;
    pvStack_48 = (void *)0x0;
    lStack_38 = *(long *)(lVar1 + 0x58);
    *(void **)(lVar1 + 0x58) = pvVar3;
    if (lStack_38 == 0) {
      return;
    }
    std::__exception_ptr::exception_ptr::_M_release();
    eVar2._M_exception_object = pvStack_48;
  }
  if (eVar2._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

static Value* contains(Key* k)
  {
    context* elem = top_;
    while (elem)
    {
      if (elem->key_ == k)
        return elem->value_;
      elem = elem->next_;
    }
    return 0;
  }